

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_client.cpp
# Opt level: O2

void __thiscall cppcms::impl::tcp_cache::stats(tcp_cache *this,uint *keys,uint *triggers)

{
  long lVar1;
  long lVar2;
  tcp_operation_header h;
  string data;
  tcp_operation_header local_78;
  string local_50;
  
  *keys = 0;
  *triggers = 0;
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < (this->super_tcp_connector).conns; lVar1 = lVar1 + 1) {
    local_78.operations.fetch.current_gen = 0;
    local_78.operations.data.timeout = 0;
    local_78.filler[0] = 0;
    local_78.filler[1] = 0;
    local_78.operations._16_8_ = 0;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_78.opcode = 4;
    local_78.size = 0;
    messenger::transmit((messenger *)(&((this->super_tcp_connector).tcp)->field_0x0 + lVar2),
                        &local_78,&local_50);
    if (local_78.opcode == 10) {
      *keys = *keys + local_78.operations.out_stats.keys;
      *triggers = *triggers + local_78.operations.out_stats.triggers;
    }
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = lVar2 + 0x60;
  }
  return;
}

Assistant:

void tcp_cache::stats(unsigned &keys,unsigned &triggers)
{
	keys=0; triggers=0;
	for(int i=0;i<conns;i++) {
		tcp_operation_header h=tcp_operation_header();
		std::string data;
		h.opcode=opcodes::stats;
		tcp[i].transmit(h,data);
		if(h.opcode==opcodes::out_stats) {
			keys+=h.operations.out_stats.keys;
			triggers+=h.operations.out_stats.triggers;
		}
	}
}